

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_swp.cpp
# Opt level: O0

int32_t ucol_swapInverseUCA_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  UBool UVar1;
  int32_t iVar2;
  uint8_t __src [8];
  uint8_t __dest [8];
  uint local_88;
  uint32_t local_84;
  InverseUCATableHeader header;
  InverseUCATableHeader *outHeader;
  InverseUCATableHeader *inHeader;
  uint8_t *outBytes;
  uint8_t *inBytes;
  int32_t headerSize;
  UDataInfo *pInfo;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  memset(&local_88,0,0x20);
  iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if (((((*(char *)((long)inData + 0xc) == 'I') && (*(char *)((long)inData + 0xd) == 'n')) &&
            (*(char *)((long)inData + 0xe) == 'v')) &&
           ((*(char *)((long)inData + 0xf) == 'C' && (*(char *)((long)inData + 0x10) == '\x02'))))
          && (*(char *)((long)inData + 0x11) != '\0')) {
    __src = (uint8_t  [8])((long)inData + (long)iVar2);
    __dest = (uint8_t  [8])((long)outData + (long)iVar2);
    header.padding = __dest;
    if (length < 0) {
      local_88 = udata_readInt32_63(ds,*(int32_t *)__src);
    }
    else if ((length - iVar2 < 0x20) ||
            (local_88 = udata_readInt32_63(ds,*(int32_t *)__src), (uint)(length - iVar2) < local_88)
            ) {
      udata_printError_63(ds,
                          "ucol_swapInverseUCA(): too few bytes (%d after header) for inverse UCA collation data\n"
                          ,(ulong)(uint)length);
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0;
    }
    if (-1 < length) {
      if (__src != __dest) {
        memcpy((void *)__dest,(void *)__src,(ulong)local_88);
      }
      local_84 = (*ds->readUInt32)(*(uint32_t *)((long)__src + 4));
      header.byteSize = (*ds->readUInt32)(*(uint32_t *)((long)__src + 8));
      header.tableSize = (*ds->readUInt32)(*(uint32_t *)((long)__src + 0xc));
      header.contsSize = (*ds->readUInt32)(*(uint32_t *)((long)__src + 0x10));
      (*ds->swapArray32)(ds,(void *)__src,0x14,(void *)header.padding,pErrorCode);
      (*ds->swapArray32)(ds,(void *)((long)__src + (ulong)header.tableSize),local_84 * 0xc,
                         (void *)((long)__dest + (ulong)header.tableSize),pErrorCode);
      (*ds->swapArray16)(ds,(void *)((long)__src + (ulong)header.contsSize),header.byteSize << 1,
                         (void *)((long)__dest + (ulong)header.contsSize),pErrorCode);
    }
    ds_local._4_4_ = iVar2 + local_88;
  }
  else {
    udata_printError_63(ds,
                        "ucol_swapInverseUCA(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not an inverse UCA collation file\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)*(byte *)((long)inData + 0xd),
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10),(uint)*(byte *)((long)inData + 0x11));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_swapInverseUCA(const UDataSwapper *ds,
                    const void *inData, int32_t length, void *outData,
                    UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    const InverseUCATableHeader *inHeader;
    InverseUCATableHeader *outHeader;
    InverseUCATableHeader header={ 0,0,0,0,0,{0,0,0,0},{0,0,0,0,0,0,0,0} };

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x49 &&   /* dataFormat="InvC" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x76 &&
        pInfo->dataFormat[3]==0x43 &&
        pInfo->formatVersion[0]==2 &&
        pInfo->formatVersion[1]>=1
    )) {
        udata_printError(ds, "ucol_swapInverseUCA(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not an inverse UCA collation file\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0], pInfo->formatVersion[1]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;

    inHeader=(const InverseUCATableHeader *)inBytes;
    outHeader=(InverseUCATableHeader *)outBytes;

    /*
     * The inverse UCA collation binary must contain at least the InverseUCATableHeader,
     * starting with its size field.
     * sizeof(UCATableHeader)==8*4 in ICU 2.8
     * check the length against the header size before reading the size field
     */
    if(length<0) {
        header.byteSize=udata_readInt32(ds, inHeader->byteSize);
    } else if(
        ((length-headerSize)<(8*4) ||
         (uint32_t)(length-headerSize)<(header.byteSize=udata_readInt32(ds, inHeader->byteSize)))
    ) {
        udata_printError(ds, "ucol_swapInverseUCA(): too few bytes (%d after header) for inverse UCA collation data\n",
                         length);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    if(length>=0) {
        /* copy everything, takes care of data that needs no swapping */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, header.byteSize);
        }

        /* swap the necessary pieces in the order of their occurrence in the data */

        /* read more of the InverseUCATableHeader (the byteSize field was read above) */
        header.tableSize=   ds->readUInt32(inHeader->tableSize);
        header.contsSize=   ds->readUInt32(inHeader->contsSize);
        header.table=       ds->readUInt32(inHeader->table);
        header.conts=       ds->readUInt32(inHeader->conts);

        /* swap the 32-bit integers in the header */
        ds->swapArray32(ds, inHeader, 5*4, outHeader, pErrorCode);

        /* swap the inverse table; tableSize counts uint32_t[3] rows */
        ds->swapArray32(ds, inBytes+header.table, header.tableSize*3*4,
                           outBytes+header.table, pErrorCode);

        /* swap the continuation table; contsSize counts UChars */
        ds->swapArray16(ds, inBytes+header.conts, header.contsSize*U_SIZEOF_UCHAR,
                           outBytes+header.conts, pErrorCode);
    }

    return headerSize+header.byteSize;
}